

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringhelper.cpp
# Opt level: O2

void strcpy_safe(char *destination,char *source,int maxLength)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)maxLength;
  if (maxLength < 1) {
    uVar3 = uVar2;
  }
  for (; (uVar4 = uVar3, uVar3 != uVar2 &&
         (cVar1 = source[uVar2], destination[uVar2] = cVar1, uVar4 = uVar2, cVar1 != '\0'));
      uVar2 = uVar2 + 1) {
  }
  destination[uVar4] = '\0';
  return;
}

Assistant:

void strcpy_safe( char *destination, char const*source, int maxLength ) {
    int i = 0;
    for( i = 0; i < maxLength; i++ ) {
        destination[i] = source[i];
        if( source[i] == 0 ) {
            break;
        }
    }
    destination[i] = 0;
}